

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O2

void triangle_points_plot
               (char *file_name,double *node_xy,int node_show,int point_num,double *point_xy,
               int point_show)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  double dVar10;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  long local_2c0;
  ofstream file_unit;
  byte abStack_2a0 [480];
  uint local_c0;
  int local_bc;
  double local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  double *local_70;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int local_34;
  
  local_c0 = point_num;
  local_bc = point_show;
  local_70 = point_xy;
  local_34 = node_show;
  std::ofstream::ofstream(&local_2c0);
  dVar10 = r8_huge();
  uStack_80 = extraout_XMM0_Qb ^ 0x8000000000000000;
  local_88 = -dVar10;
  for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)node_xy + lVar4);
    if (*(double *)((long)node_xy + lVar4) <= local_88) {
      dVar10 = local_88;
    }
    uStack_80 = 0;
    local_88 = dVar10;
  }
  lVar4 = 0;
  uVar6 = 0;
  if (0 < (int)local_c0) {
    uVar6 = (ulong)local_c0;
  }
  local_a0 = uVar6 << 4;
  for (; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)local_70 + lVar4);
    if (*(double *)((long)local_70 + lVar4) <= local_88) {
      dVar10 = local_88;
    }
    uStack_80 = 0;
    local_88 = dVar10;
  }
  local_50 = r8_huge();
  for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)node_xy + lVar4);
    if (local_50 <= *(double *)((long)node_xy + lVar4)) {
      dVar10 = local_50;
    }
    local_50 = dVar10;
  }
  for (lVar4 = 0; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)local_70 + lVar4);
    if (local_50 <= *(double *)((long)local_70 + lVar4)) {
      dVar10 = local_50;
    }
    local_50 = dVar10;
  }
  dVar10 = r8_huge();
  local_b8 = (local_88 - local_50) * 0.05 + local_88;
  local_50 = (local_88 - local_50) * -0.05 + local_50;
  local_88 = local_b8 - local_50;
  uStack_90 = extraout_XMM0_Qb_00 ^ 0x8000000000000000;
  local_98 = -dVar10;
  for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)node_xy + lVar4);
    if (*(double *)((long)node_xy + lVar4) <= local_98) {
      dVar10 = local_98;
    }
    uStack_90 = 0;
    local_98 = dVar10;
  }
  for (lVar4 = 0; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
    dVar10 = *(double *)((long)local_70 + lVar4 + 8);
    if (dVar10 <= local_98) {
      dVar10 = local_98;
    }
    uStack_90 = 0;
    local_98 = dVar10;
  }
  dVar10 = r8_huge();
  for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
    dVar1 = *(double *)((long)node_xy + lVar4);
    if (dVar10 <= *(double *)((long)node_xy + lVar4)) {
      dVar1 = dVar10;
    }
    dVar10 = dVar1;
  }
  for (lVar4 = 0; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
    dVar1 = *(double *)((long)local_70 + lVar4 + 8);
    if (dVar10 <= dVar1) {
      dVar1 = dVar10;
    }
    dVar10 = dVar1;
  }
  local_b0 = (local_98 - dVar10) * 0.05 + local_98;
  local_98 = (local_98 - dVar10) * -0.05 + dVar10;
  local_a8 = local_b0 - local_98;
  local_58 = 5.33590897508546e-322;
  iVar9 = 0x7e;
  if (local_a8 <= local_88) {
    iVar2 = 0x12;
    local_48 = (double)CONCAT44(local_48._4_4_,0x24);
    local_60 = (double)CONCAT44(local_60._4_4_,0x252);
    iVar7 = 0x240;
    if (local_a8 < local_88) {
      iVar3 = r8_nint(((local_88 - local_a8) * 540.0) / (local_88 + local_88));
      local_40 = (double)CONCAT44(local_40._4_4_,0x29a - iVar3);
      iVar9 = iVar3 + 0x7e;
      local_64 = 0x2ac - iVar3;
      local_58 = (double)(ulong)(iVar3 + 0x6c);
      goto LAB_00208349;
    }
  }
  else {
    iVar2 = r8_nint(((local_a8 - local_88) * 540.0) / (local_a8 + local_a8));
    iVar7 = 0x240 - iVar2;
    local_48 = (double)CONCAT44(local_48._4_4_,iVar2 + 0x24);
    local_60 = (double)CONCAT44(local_60._4_4_,0x252 - iVar2);
    iVar2 = iVar2 + 0x12;
  }
  local_64 = 0x2ac;
  local_40 = (double)CONCAT44(local_40._4_4_,0x29a);
LAB_00208349:
  std::ofstream::open((char *)&local_2c0,(_Ios_Openmode)file_name);
  if ((abStack_2a0[*(long *)(local_2c0 + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&local_2c0,"%//PS-Adobe-3.0 EPSF-3.0\n");
    std::operator<<((ostream *)&local_2c0,"%%Creator: triangulation_order3_plot.C\n");
    poVar5 = std::operator<<((ostream *)&local_2c0,"%%Title: ");
    poVar5 = std::operator<<(poVar5,file_name);
    std::operator<<(poVar5,"\n");
    std::operator<<((ostream *)&local_2c0,"%%Pages: 1\n");
    poVar5 = std::operator<<((ostream *)&local_2c0,"%%BoundingBox:  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40._0_4_);
    std::operator<<(poVar5,"\n");
    std::operator<<((ostream *)&local_2c0,"%%Document-Fonts: Times-Roman\n");
    std::operator<<((ostream *)&local_2c0,"%%LanguageLevel: 1\n");
    std::operator<<((ostream *)&local_2c0,"%%EndComments\n");
    std::operator<<((ostream *)&local_2c0,"%%BeginProlog\n");
    std::operator<<((ostream *)&local_2c0,"/inch {72 mul} def\n");
    std::operator<<((ostream *)&local_2c0,"%%EndProlog\n");
    std::operator<<((ostream *)&local_2c0,"%%Page: 1 1\n");
    std::operator<<((ostream *)&local_2c0,"save\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Set the RGB line color to very light gray.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"0.900  0.900  0.900 setrgbcolor\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Draw a gray border around the page.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"newpath\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,local_48._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
    std::operator<<(poVar5,"  moveto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar7);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar7);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40._0_4_);
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,local_48._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40._0_4_);
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,local_48._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
    std::operator<<(poVar5,"  lineto\n");
    std::operator<<((ostream *)&local_2c0,"stroke\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to black.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"0.000  0.000  0.000 setrgbcolor\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Set the font and its size.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"/Times-Roman findfont\n");
    std::operator<<((ostream *)&local_2c0,"0.50 inch scalefont\n");
    std::operator<<((ostream *)&local_2c0,"setfont\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Print a title.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  210  702  moveto\n");
    std::operator<<((ostream *)&local_2c0,"%  (Triangulation)  show\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  Define a clipping polygon.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"newpath\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar2);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(local_58,0));
    std::operator<<(poVar5,"  moveto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,local_60._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(local_58,0));
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,local_60._0_4_);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_64);
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar2);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_64);
    std::operator<<(poVar5,"  lineto\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar2);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(local_58,0));
    std::operator<<(poVar5,"  lineto\n");
    std::operator<<((ostream *)&local_2c0,"clip newpath\n");
    local_48 = (double)local_48._0_4_;
    local_58 = (double)iVar7;
    local_60 = (double)iVar9;
    local_40 = (double)local_40._0_4_;
    if (-1 < local_34) {
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to red.\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"0.900  0.200  0.100 setrgbcolor\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"%  Draw the triangle.\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"newpath\n");
      for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
        iVar2 = i4_wrap(iVar9,0,2);
        iVar7 = r8_nint(((local_b8 - node_xy[iVar2 * 2]) * local_48 +
                        (node_xy[iVar2 * 2] - local_50) * local_58) / local_88);
        iVar2 = r8_nint(((local_b0 - node_xy[(int)(iVar2 * 2 | 1)]) * local_60 +
                        (node_xy[(int)(iVar2 * 2 | 1)] - local_98) * local_40) / local_a8);
        if (iVar9 == 0) {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar7);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          pcVar8 = "  moveto\n";
        }
        else {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,iVar7);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          pcVar8 = "  lineto\n";
        }
        std::operator<<(poVar5,pcVar8);
      }
      std::operator<<((ostream *)&local_2c0,"stroke\n");
      if (local_34 != 0) {
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"%  Draw filled dots at the nodes.\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to blue.\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"0.000  0.150  0.750 setrgbcolor\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
          dVar10 = *(double *)((long)node_xy + lVar4 + -8);
          iVar9 = r8_nint(((local_b8 - dVar10) * local_48 + (dVar10 - local_50) * local_58) /
                          local_88);
          iVar2 = r8_nint(((local_b0 - *(double *)((long)node_xy + lVar4)) * local_60 +
                          (*(double *)((long)node_xy + lVar4) - local_98) * local_40) / local_a8);
          poVar5 = std::operator<<((ostream *)&local_2c0,"newpath  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,5);
          std::operator<<(poVar5,"  0 360 arc closepath fill\n");
        }
        if (1 < local_34) {
          std::operator<<((ostream *)&local_2c0,"%\n");
          std::operator<<((ostream *)&local_2c0,"%  Label the nodes:\n");
          std::operator<<((ostream *)&local_2c0,"%\n");
          std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to darker blue.\n");
          std::operator<<((ostream *)&local_2c0,"%\n");
          std::operator<<((ostream *)&local_2c0,"0.000  0.250  0.850 setrgbcolor\n");
          std::operator<<((ostream *)&local_2c0,"/Times-Roman findfont\n");
          std::operator<<((ostream *)&local_2c0,"0.20 inch scalefont\n");
          std::operator<<((ostream *)&local_2c0,"setfont\n");
          std::operator<<((ostream *)&local_2c0,"%\n");
          iVar9 = 1;
          for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
            dVar10 = *(double *)((long)node_xy + lVar4 + -8);
            iVar2 = r8_nint(((local_b8 - dVar10) * local_48 + (dVar10 - local_50) * local_58) /
                            local_88);
            iVar7 = r8_nint(((local_b0 - *(double *)((long)node_xy + lVar4)) * local_60 +
                            (*(double *)((long)node_xy + lVar4) - local_98) * local_40) / local_a8);
            poVar5 = std::operator<<((ostream *)&local_2c0,"  ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7 + 5);
            poVar5 = std::operator<<(poVar5,"  moveto (");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
            iVar9 = iVar9 + 1;
            std::operator<<(poVar5,") show\n");
          }
        }
      }
    }
    if ((int)local_c0 < 0xc9) {
      local_34 = 5;
    }
    else if (local_c0 < 0x1f5) {
      local_34 = 4;
    }
    else if (local_c0 < 0x3e9) {
      local_34 = 3;
    }
    else {
      local_34 = (local_c0 < 0x1389) + 1;
    }
    if (0 < local_bc) {
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"%  Draw filled dots at the points.\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to green.\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      std::operator<<((ostream *)&local_2c0,"0.150  0.750  0.000 setrgbcolor\n");
      std::operator<<((ostream *)&local_2c0,"%\n");
      iVar9 = 1;
      for (lVar4 = 0; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
        iVar2 = r8_nint(((local_b8 - *(double *)((long)local_70 + lVar4)) * local_48 +
                        (*(double *)((long)local_70 + lVar4) - local_50) * local_58) / local_88);
        dVar10 = *(double *)((long)local_70 + lVar4 + 8);
        iVar7 = r8_nint(((local_b0 - dVar10) * local_60 + (dVar10 - local_98) * local_40) / local_a8
                       );
        poVar5 = std::operator<<((ostream *)&local_2c0,"newpath  ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_34);
        std::operator<<(poVar5,"  0 360 arc closepath fill\n");
      }
      if (local_bc != 1) {
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"%  Label the point:\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"%  Set the RGB color to darker green.\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        std::operator<<((ostream *)&local_2c0,"0.250  0.850  0.000 setrgbcolor\n");
        std::operator<<((ostream *)&local_2c0,"/Times-Roman findfont\n");
        std::operator<<((ostream *)&local_2c0,"0.20 inch scalefont\n");
        std::operator<<((ostream *)&local_2c0,"setfont\n");
        std::operator<<((ostream *)&local_2c0,"%\n");
        for (lVar4 = 0; local_a0 != lVar4; lVar4 = lVar4 + 0x10) {
          iVar2 = r8_nint(((local_b8 - *(double *)((long)local_70 + lVar4)) * local_48 +
                          (*(double *)((long)local_70 + lVar4) - local_50) * local_58) / local_88);
          dVar10 = *(double *)((long)local_70 + lVar4 + 8);
          iVar7 = r8_nint(((local_b0 - dVar10) * local_60 + (dVar10 - local_98) * local_40) /
                          local_a8);
          poVar5 = std::operator<<((ostream *)&local_2c0,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7 + 5);
          poVar5 = std::operator<<(poVar5,"  moveto (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          iVar9 = iVar9 + 1;
          std::operator<<(poVar5,") show\n");
        }
      }
    }
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"restore  showpage\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%  End of page.\n");
    std::operator<<((ostream *)&local_2c0,"%\n");
    std::operator<<((ostream *)&local_2c0,"%%Trailer\n");
    std::operator<<((ostream *)&local_2c0,"%%EOF\n");
    std::ofstream::close();
    std::ofstream::~ofstream(&local_2c0);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"TRIANGLE_POINTS_PLOT - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Could not open the output EPS file.\n");
  exit(1);
}

Assistant:

void triangle_points_plot ( char *file_name, double node_xy[], int node_show, 
  int point_num, double point_xy[], int point_show )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_POINTS_PLOT plots a triangle and some points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, char *FILE_NAME, the name of the output file.
//
//    Input, double NODE_XY[2*3], the coordinates of the nodes
//    of the triangle.
//
//    Input, int NODE_SHOW,
//   -1, do not show the triangle, or the nodes.
//    0, show the triangle, do not show the nodes;
//    1, show the triangle and the nodes;
//    2, show the triangle, the nodes and number them.
//
//    Input, int POINT_NUM, the number of points.
//
//    Input, double POINT_XY[2*POINT_NUM], the coordinates of the 
//    points.
//
//    Input, int POINT_SHOW,
//    0, do not show the points;
//    1, show the points;
//    2, show the points and number them.
//
{
  int circle_size;
  int delta;
  std::ofstream file_unit;
  int i;
  int node;
  int node_num = 3;
  int point;
  double x_max;
  double x_min;
  int x_ps;
  int x_ps_max = 576;
  int x_ps_max_clip = 594;
  int x_ps_min = 36;
  int x_ps_min_clip = 18;
  double x_scale;
  double y_max;
  double y_min;
  int y_ps;
  int y_ps_max = 666;
  int y_ps_max_clip = 684;
  int y_ps_min = 126;
  int y_ps_min_clip = 108;
  double y_scale;
//
//  We need to do some figuring here, so that we can determine
//  the range of the data, and hence the height and width
//  of the piece of paper.
//
  x_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( x_max < node_xy[0+node*2] )
    {
      x_max = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( x_max < point_xy[0+point*2] )
    {
      x_max = point_xy[0+point*2];
    }
  }

  x_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[0+node*2] < x_min )
    {
      x_min = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[0+point*2] < x_min )
    {
      x_min = point_xy[0+point*2];
    }
  }
  x_scale = x_max - x_min;

  x_max = x_max + 0.05 * x_scale;
  x_min = x_min - 0.05 * x_scale;
  x_scale = x_max - x_min;

  y_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( y_max < node_xy[1+node*2] )
    {
      y_max = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( y_max < point_xy[1+point*2] )
    {
      y_max = point_xy[1+point*2];
    }
  }

  y_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[1+node*2] < y_min )
    {
      y_min = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[1+point*2] < y_min )
    {
      y_min = point_xy[1+point*2];
    }
  }
  y_scale = y_max - y_min;

  y_max = y_max + 0.05 * y_scale;
  y_min = y_min - 0.05 * y_scale;
  y_scale = y_max - y_min;

  if ( x_scale < y_scale )
  {
    delta = r8_nint ( double( x_ps_max - x_ps_min ) 
      * ( y_scale - x_scale ) / ( 2.0 * y_scale ) );

    x_ps_max = x_ps_max - delta;
    x_ps_min = x_ps_min + delta;

    x_ps_max_clip = x_ps_max_clip - delta;
    x_ps_min_clip = x_ps_min_clip + delta;

    x_scale = y_scale;
  }
  else if ( y_scale < x_scale )
  {
    delta = r8_nint ( double( y_ps_max - y_ps_min ) 
      * ( x_scale - y_scale ) / ( 2.0 * x_scale ) );

    y_ps_max      = y_ps_max - delta;
    y_ps_min      = y_ps_min + delta;

    y_ps_max_clip = y_ps_max_clip - delta;
    y_ps_min_clip = y_ps_min_clip + delta;

    y_scale = x_scale;
  }

  file_unit.open ( file_name );

  if ( !file_unit )
  {
    std::cerr << "\n";
    std::cerr << "TRIANGLE_POINTS_PLOT - Fatal error!\n";
    std::cerr << "  Could not open the output EPS file.\n";
    exit ( 1 );
  }

  file_unit << "%//PS-Adobe-3.0 EPSF-3.0\n";
  file_unit << "%%Creator: triangulation_order3_plot.C\n";
  file_unit << "%%Title: " << file_name << "\n";
  file_unit << "%%Pages: 1\n";
  file_unit << "%%BoundingBox:  "
    << x_ps_min << "  "
    << y_ps_min << "  "
    << x_ps_max << "  "
    << y_ps_max << "\n";
  file_unit << "%%Document-Fonts: Times-Roman\n";
  file_unit << "%%LanguageLevel: 1\n";
  file_unit << "%%EndComments\n";
  file_unit << "%%BeginProlog\n";
  file_unit << "/inch {72 mul} def\n";
  file_unit << "%%EndProlog\n";
  file_unit << "%%Page: 1 1\n";
  file_unit << "save\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB line color to very light gray.\n";
  file_unit << "%\n";
  file_unit << "0.900  0.900  0.900 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Draw a gray border around the page.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  moveto\n";
  file_unit << x_ps_max << "  "
            << y_ps_min << "  lineto\n";
  file_unit << x_ps_max << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  lineto\n";
  file_unit << "stroke\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB color to black.\n";
  file_unit << "%\n";
  file_unit << "0.000  0.000  0.000 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Set the font and its size.\n";
  file_unit << "%\n";
  file_unit << "/Times-Roman findfont\n";
  file_unit << "0.50 inch scalefont\n";
  file_unit << "setfont\n";
  file_unit << "%\n";
  file_unit << "%  Print a title.\n";
  file_unit << "%\n";
  file_unit << "%  210  702  moveto\n";
  file_unit << "%  (Triangulation)  show\n";
  file_unit << "%\n";
  file_unit << "%  Define a clipping polygon.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  moveto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << "clip newpath\n";
//
//  Draw the triangle.
//
  if ( 0 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to red.\n";
    file_unit << "%\n";
    file_unit << "0.900  0.200  0.100 setrgbcolor\n";
    file_unit << "%\n";
    file_unit << "%  Draw the triangle.\n";
    file_unit << "%\n";

    file_unit << "newpath\n";

    for ( i = 0; i <= 3; i++ )
    {
      node = i4_wrap ( i, 0, 2 );

      x_ps = ( r8_nint ) ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = ( r8_nint ) ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      if ( i == 0 )
      {
        file_unit << x_ps << "  " << y_ps << "  moveto\n";
      }
      else
      {
        file_unit << x_ps << "  " << y_ps << "  lineto\n";
      }
    }
    file_unit << "stroke\n";
  }
//
//  Draw the nodes.
//
  if ( 1 <= node_show )
  {
    circle_size = 5;

    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the nodes.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.150  0.750 setrgbcolor\n";
    file_unit << "%\n";

    for ( node = 0; node < 3; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the nodes.
//
  if ( 2 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the nodes:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.250  0.850 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( node = 0; node < node_num; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (       + node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit  << "  " << x_ps
                 << "  " << y_ps + 5
                 << "  moveto (" << node+1 << ") show\n";
    }
  }
//
//  Draw the points.
//
  if ( point_num <= 200 )
  {
    circle_size = 5;
  }
  else if ( point_num <= 500 )
  {
    circle_size = 4;
  }
  else if ( point_num <= 1000 )
  {
    circle_size = 3;
  }
  else if ( point_num <= 5000 )
  {
    circle_size = 2;
  }
  else
  {
    circle_size = 1;
  }

  if ( 1 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the points.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to green.\n";
    file_unit << "%\n";
    file_unit << "0.150  0.750  0.000 setrgbcolor\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (         point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the points.
//
  if ( 2 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the point:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker green.\n";
    file_unit << "%\n";
    file_unit << "0.250  0.850  0.000 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (       + point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "  " << x_ps
                << "  " << y_ps + 5
                << "  moveto (" << point+1 << ") show\n";
    }
  }

  file_unit << "%\n";
  file_unit << "restore  showpage\n";
  file_unit << "%\n";
  file_unit << "%  End of page.\n";
  file_unit << "%\n";
  file_unit << "%%Trailer\n";
  file_unit << "%%EOF\n";

  file_unit.close ( );

  return;
}